

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O2

bool __thiscall sptk::SymmetricMatrix::Invert(SymmetricMatrix *this,SymmetricMatrix *inverse_matrix)

{
  uint uVar1;
  pointer ppdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  bool bVar6;
  undefined7 extraout_var;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int j;
  int k;
  ulong uVar11;
  ulong uVar12;
  double sum;
  double dVar13;
  allocator_type local_ad;
  undefined4 local_ac;
  SymmetricMatrix *local_a8;
  vector<double,_std::allocator<double>_> inverse_diagonal_elements;
  vector<double,_std::allocator<double>_> diagonal_elements;
  SymmetricMatrix lower_triangular_matrix;
  
  if (this == inverse_matrix || inverse_matrix == (SymmetricMatrix *)0x0) {
    local_ac = 0;
  }
  else {
    iVar9 = inverse_matrix->num_dimension_;
    if (iVar9 != this->num_dimension_) {
      Resize(inverse_matrix,this->num_dimension_);
      iVar9 = this->num_dimension_;
    }
    SymmetricMatrix(&lower_triangular_matrix,iVar9);
    std::vector<double,_std::allocator<double>_>::vector
              (&diagonal_elements,(long)this->num_dimension_,
               (allocator_type *)&inverse_diagonal_elements);
    local_a8 = this;
    bVar6 = CholeskyDecomposition(this,&lower_triangular_matrix,&diagonal_elements);
    local_ac = (undefined4)CONCAT71(extraout_var,bVar6);
    if (bVar6) {
      uVar1 = local_a8->num_dimension_;
      lVar7 = (ulong)uVar1 * 8;
      uVar12 = (ulong)uVar1;
      while (iVar9 = (int)uVar12, 0 < iVar9) {
        uVar10 = uVar12 - 1;
        ppdVar2 = (inverse_matrix->index_).super__Vector_base<double_*,_std::allocator<double_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar3 = ppdVar2[uVar10];
        pdVar3[uVar10] = 1.0;
        for (; (int)uVar12 < (int)uVar1; uVar12 = uVar12 + 1) {
          pdVar4 = lower_triangular_matrix.index_.
                   super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
          dVar13 = pdVar4[uVar10] * pdVar3[uVar10];
          pdVar5 = ppdVar2[uVar12];
          pdVar5[uVar10] = dVar13;
          for (lVar8 = 0; iVar9 + (int)lVar8 < (int)uVar12; lVar8 = lVar8 + 1) {
            dVar13 = dVar13 + *(double *)((long)pdVar4 + lVar8 * 8 + lVar7) *
                              *(double *)(*(long *)((long)ppdVar2 + lVar8 * 8 + lVar7) + uVar10 * 8)
            ;
            pdVar5[uVar10] = dVar13;
          }
          pdVar5[uVar10] = dVar13 * -pdVar5[uVar12];
        }
        lVar7 = lVar7 + -8;
        uVar12 = uVar10;
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&inverse_diagonal_elements,(long)(int)uVar1,&local_ad);
      uVar1 = local_a8->num_dimension_;
      uVar10 = 0;
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
      for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        inverse_diagonal_elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] =
             1.0 / diagonal_elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
      }
      lVar7 = 1;
      for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
        ppdVar2 = (inverse_matrix->index_).super__Vector_base<double_*,_std::allocator<double_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar3 = ppdVar2[uVar10];
        for (lVar8 = 0; lVar8 != lVar7; lVar8 = lVar8 + 1) {
          dVar13 = 0.0;
          for (uVar11 = uVar10; uVar1 != uVar11; uVar11 = uVar11 + 1) {
            pdVar4 = ppdVar2[uVar11];
            dVar13 = dVar13 + pdVar4[uVar10] *
                              inverse_diagonal_elements.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar11] * pdVar4[lVar8];
          }
          pdVar3[lVar8] = dVar13;
        }
        lVar7 = lVar7 + 1;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&inverse_diagonal_elements.super__Vector_base<double,_std::allocator<double>_>);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&diagonal_elements.super__Vector_base<double,_std::allocator<double>_>);
    ~SymmetricMatrix(&lower_triangular_matrix);
  }
  return SUB41(local_ac,0);
}

Assistant:

bool SymmetricMatrix::Invert(SymmetricMatrix* inverse_matrix) const {
  if (NULL == inverse_matrix || this == inverse_matrix) {
    return false;
  }

  if (inverse_matrix->num_dimension_ != num_dimension_) {
    inverse_matrix->Resize(num_dimension_);
  }

  SymmetricMatrix lower_triangular_matrix(num_dimension_);
  std::vector<double> diagonal_elements(num_dimension_);
  if (!CholeskyDecomposition(&lower_triangular_matrix, &diagonal_elements)) {
    return false;
  }

  for (int i(num_dimension_ - 1); 0 <= i; --i) {
    inverse_matrix->index_[i][i] = 1.0;
    for (int j(i + 1); j < num_dimension_; ++j) {
      inverse_matrix->index_[j][i] =
          lower_triangular_matrix.index_[j][i] * inverse_matrix->index_[i][i];
      for (int k(i + 1); k < j; ++k) {
        inverse_matrix->index_[j][i] +=
            lower_triangular_matrix.index_[j][k] * inverse_matrix->index_[k][i];
      }
      inverse_matrix->index_[j][i] *= -inverse_matrix->index_[j][j];
    }
  }

  std::vector<double> inverse_diagonal_elements(num_dimension_);
  for (int i(0); i < num_dimension_; ++i) {
    inverse_diagonal_elements[i] = 1.0 / diagonal_elements[i];
  }

  for (int i(0); i < num_dimension_; ++i) {
    for (int j(0); j <= i; ++j) {
      double sum(0.0);
      for (int k(i); k < num_dimension_; ++k) {
        sum += inverse_matrix->index_[k][i] * inverse_diagonal_elements[k] *
               inverse_matrix->index_[k][j];
      }
      inverse_matrix->index_[i][j] = sum;
    }
  }

  return true;
}